

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

void Window_To_Buffer(WINDOW_conflict *win,FIELD *field)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (((win == (WINDOW_conflict *)0x0) || (field == (FIELD *)0x0)) ||
     (pcVar3 = field->buf, pcVar3 == (char *)0x0)) {
    __assert_fail("win && field && field->buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                  ,0x184,"void Window_To_Buffer(WINDOW *, FIELD *)");
  }
  iVar2 = field->pad;
  sVar1 = win->_maxy;
  if (sVar1 < 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar6 = 0;
    do {
      if (field->drows <= iVar6) break;
      wmove(win,iVar6,0);
      iVar4 = winnstr(win,pcVar3 + iVar7,field->dcols);
      iVar7 = iVar7 + iVar4;
      iVar6 = iVar6 + 1;
    } while (sVar1 + 1 != iVar6);
  }
  pcVar3[iVar7] = '\0';
  if ((iVar2 != 0x20) && (0 < iVar7)) {
    lVar5 = 0;
    do {
      if (iVar2 == pcVar3[lVar5]) {
        pcVar3[lVar5] = ' ';
      }
      lVar5 = lVar5 + 1;
    } while (iVar7 != (int)lVar5);
  }
  return;
}

Assistant:

static void Window_To_Buffer(WINDOW * win, FIELD  * field)
{
  int pad;
  int len = 0;
  char *p;
  int row, height, width;
  
  assert(win && field && field->buf );

  pad = field->pad;
  p = field->buf;
  getmaxyx(win, height, width);

  for(row=0; (row < height) && (row < field->drows); row++ )
    {
      wmove( win, row, 0 );
      len += winnstr( win, p+len, field->dcols );
    }
  p[len] = '\0';

  /* replace visual padding character by blanks in buffer */
  if (pad != C_BLANK)
    {
      int i;
      for(i=0; i<len; i++, p++)
        {
          if (*p==pad) 
            *p = C_BLANK;
        }
    }
}